

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O2

ExponentiallyDecayingReservoir * __thiscall
cppmetrics::ExponentiallyDecayingReservoir::operator=
          (ExponentiallyDecayingReservoir *this,ExponentiallyDecayingReservoir *other)

{
  time_t tVar1;
  
  std::mutex::lock(&other->m_mutex);
  LOCK();
  (this->m_count).super___atomic_base<long>._M_i = (other->m_count).super___atomic_base<long>._M_i;
  UNLOCK();
  this->m_clock = other->m_clock;
  tVar1 = other->m_next_rescale_time;
  this->m_start = other->m_start;
  this->m_next_rescale_time = tVar1;
  this->m_size = other->m_size;
  this->m_alpha = other->m_alpha;
  std::
  _Rb_tree<double,_std::pair<const_double,_cppmetrics::WeightedSample>,_std::_Select1st<std::pair<const_double,_cppmetrics::WeightedSample>_>,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  ::operator=(&(this->m_samples)._M_t,&(other->m_samples)._M_t);
  LOCK();
  (other->m_count).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  other->m_next_rescale_time = 0;
  other->m_size = 0;
  other->m_clock = (Clock *)0x0;
  other->m_start = 0;
  other->m_alpha = 0.0;
  pthread_mutex_unlock((pthread_mutex_t *)&other->m_mutex);
  return this;
}

Assistant:

ExponentiallyDecayingReservoir& ExponentiallyDecayingReservoir::operator=(ExponentiallyDecayingReservoir&& other)
{
  std::lock_guard<std::mutex> lock(other.m_mutex);

  m_count.store(other.m_count.load());
  m_clock = other.m_clock;
  m_start = other.m_start;
  m_next_rescale_time = other.m_next_rescale_time;
  m_size = other.m_size;
  m_alpha = other.m_alpha;
  m_samples = std::move(other.m_samples);

  other.m_count.store(0);
  other.m_clock = nullptr;
  other.m_start = 0;
  other.m_next_rescale_time = 0;
  other.m_size = 0;
  other.m_alpha = 0.0;
  // other.m_samples is already moved

  return *this;
}